

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::CustomLayerParams::_InternalSerialize
          (CustomLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  MapFieldLite<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *pMVar1;
  uint value;
  long lVar2;
  void *data;
  undefined8 *puVar3;
  Type *this_00;
  int iVar4;
  int index;
  CustomLayerParams *pCVar5;
  undefined8 *puVar6;
  uint8_t *target_00;
  ulong uVar7;
  ulong uVar8;
  size_t __n;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_68;
  CustomLayerParams *local_50;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_48;
  
  puVar3 = (undefined8 *)((ulong)(this->classname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar3[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,(int)lVar2,SERIALIZE,
               "CoreML.Specification.CustomLayerParams.className");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,10,
                        (string *)((ulong)(this->classname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  iVar4 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  local_50 = this;
  if (iVar4 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::TypeHandler>
                          (&(this->weights_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xa2;
      target[1] = '\x01';
      value = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[2] = (uint8_t)value;
      if (value < 0x80) {
        target_00 = target + 3;
      }
      else {
        target_00 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                              (value,target + 2);
      }
      target = WeightParams::_InternalSerialize(this_00,target_00,stream);
      index = index + 1;
    } while (iVar4 != index);
  }
  pCVar5 = local_50;
  uVar8 = (local_50->parameters_).map_.elements_.num_elements_;
  if (uVar8 != 0) {
    pMVar1 = &local_50->parameters_;
    local_48.m_ = (InnerMap *)pMVar1;
    if ((uVar8 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
      ::SearchFrom(&local_48,(local_50->parameters_).map_.elements_.index_of_first_non_null_);
      local_68.bucket_index_ = local_48.bucket_index_;
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(0x1e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_68.node_,
                                     (CustomLayerParams_CustomLayerParamValue *)
                                     &(local_68.node_)->field_0x20,target,stream);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (*(char **)local_68.node_,(int)*(size_type *)&(local_68.node_)->field_0x8,
                   SERIALIZE,"CoreML.Specification.CustomLayerParams.ParametersEntry.key");
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
        ::operator++(&local_68);
      }
    }
    else {
      puVar3 = (undefined8 *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
      ::SearchFrom(&local_48,(pCVar5->parameters_).map_.elements_.index_of_first_non_null_);
      local_68.bucket_index_ = local_48.bucket_index_;
      local_68.node_ = local_48.node_;
      local_68.m_ = local_48.m_;
      if (local_48.node_ != (Node *)0x0) {
        puVar6 = puVar3;
        uVar8 = 0;
        do {
          uVar7 = uVar8;
          *puVar6 = local_68.node_;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
          ::InnerMap::
          iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
          ::operator++(&local_68);
          uVar8 = uVar7 + 1;
          puVar6 = puVar6 + 1;
        } while (local_68.node_ != (Node *)0x0);
        if (uVar8 != 0) {
          lVar2 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>const*>>>
                    (puVar3,puVar6,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>const*>>>
                    (puVar3,puVar6);
          uVar8 = 0xffffffffffffffff;
          do {
            target = google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                     ::InternalSerialize(0x1e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)puVar3[uVar8 + 1],
                                         (CustomLayerParams_CustomLayerParamValue *)
                                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)puVar3[uVar8 + 1] + 1),target,stream);
            google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      (*(char **)puVar3[uVar8 + 1],*(int *)((undefined8 *)puVar3[uVar8 + 1] + 1),
                       SERIALIZE,"CoreML.Specification.CustomLayerParams.ParametersEntry.key");
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
      }
      operator_delete__(puVar3);
      pCVar5 = local_50;
    }
  }
  puVar3 = (undefined8 *)((ulong)(pCVar5->description_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar3[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,(int)lVar2,SERIALIZE,
               "CoreML.Specification.CustomLayerParams.description");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x28,
                        (string *)
                        ((ulong)(pCVar5->description_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  uVar8 = (pCVar5->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    uVar8 = uVar8 & 0xfffffffffffffffc;
    data = *(void **)(uVar8 + 8);
    iVar4 = (int)*(undefined8 *)(uVar8 + 0x10);
    __n = (size_t)iVar4;
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar4,target)
      ;
    }
    else {
      memcpy(target,data,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* CustomLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CustomLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string className = 10;
  if (!this->_internal_classname().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_classname().data(), static_cast<int>(this->_internal_classname().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomLayerParams.className");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_classname(), target);
  }

  // repeated .CoreML.Specification.WeightParams weights = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_weights_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_weights(i), target, stream);
  }

  // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
  if (!this->_internal_parameters().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.CustomLayerParams.ParametersEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_parameters().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_parameters().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::const_iterator
          it = this->_internal_parameters().begin();
          it != this->_internal_parameters().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = CustomLayerParams_ParametersEntry_DoNotUse::Funcs::InternalSerialize(30, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::const_iterator
          it = this->_internal_parameters().begin();
          it != this->_internal_parameters().end(); ++it) {
        target = CustomLayerParams_ParametersEntry_DoNotUse::Funcs::InternalSerialize(30, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  // string description = 40;
  if (!this->_internal_description().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_description().data(), static_cast<int>(this->_internal_description().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomLayerParams.description");
    target = stream->WriteStringMaybeAliased(
        40, this->_internal_description(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CustomLayerParams)
  return target;
}